

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O3

QList<int> * __thiscall
QColumnView::columnWidths(QList<int> *__return_storage_ptr__,QColumnView *this)

{
  long lVar1;
  uint uVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  int local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (int *)0x0;
  (__return_storage_ptr__->d).size = 0;
  uVar2 = (uint)*(undefined8 *)(lVar1 + 0x550);
  QList<int>::reserve(__return_storage_ptr__,(long)(int)uVar2);
  if (0 < (int)uVar2) {
    uVar3 = 0;
    do {
      local_34 = *(int *)(*(long *)(lVar1 + 0x560) + uVar3 * 4);
      QtPrivate::QPodArrayOps<int>::emplace<int&>
                ((QPodArrayOps<int> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
                 &local_34);
      QList<int>::end(__return_storage_ptr__);
      uVar3 = uVar3 + 1;
    } while ((uVar2 & 0x7fffffff) != uVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<int> QColumnView::columnWidths() const
{
    Q_D(const QColumnView);
    QList<int> list;
    const int columnCount = d->columns.size();
    list.reserve(columnCount);
    for (int i = 0; i < columnCount; ++i)
        list.append(d->columnSizes.at(i));
    return list;
}